

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

_Bool is_close_frame(uint16_t status_code,_Bool status_code_required)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  uint8_t mask [4];
  undefined4 local_1c;
  ulong length;
  
  sVar3 = write_buffer_parse_pos;
  if (((char)write_buffer[write_buffer_parse_pos] < '\0') &&
     (sVar3 = write_buffer_parse_pos + 1, (write_buffer[write_buffer_parse_pos] & 8) != 0)) {
    uVar4 = write_buffer[write_buffer_parse_pos + 1] & 0x7f;
    length = (ulong)uVar4;
    bVar1 = (byte)uVar4;
    sVar3 = write_buffer_parse_pos + 2;
    if (0x83 < (byte)(bVar1 + 0x82)) {
      if ((char)write_buffer[write_buffer_parse_pos + 1] < '\0') {
        lVar2 = write_buffer_parse_pos + 6;
        local_1c = *(undefined4 *)(write_buffer + write_buffer_parse_pos + 2);
        write_buffer_parse_pos = write_buffer_parse_pos + 6;
        length = (ulong)bVar1;
        cio_websocket_mask(write_buffer + lVar2,length,(uint8_t *)&local_1c);
        sVar3 = write_buffer_parse_pos;
      }
      write_buffer_parse_pos = length + sVar3;
      return *(uint16_t *)(write_buffer + sVar3) == status_code;
    }
  }
  write_buffer_parse_pos = sVar3;
  return false;
}

Assistant:

static bool is_close_frame(uint16_t status_code, bool status_code_required)
{
	if ((write_buffer[write_buffer_parse_pos] & WS_HEADER_FIN) != WS_HEADER_FIN) {
		return false;
	}

	if ((write_buffer[write_buffer_parse_pos++] & WS_CLOSE_FRAME) == 0) {
		return false;
	}

	uint8_t first_length = write_buffer[write_buffer_parse_pos++];
	bool is_masked = ((first_length & WS_MASK_SET) == WS_MASK_SET);
	first_length = first_length & (uint8_t)~WS_MASK_SET;
	if (first_length > CIO_WEBSOCKET_SMALL_FRAME_SIZE) {
		return false;
	}

	if ((first_length == 0) && (status_code_required)) {
		return false;
	}

	if (first_length == 1) {
		return false;
	}

	if (first_length > 0) {
		if (is_masked) {
			uint8_t mask[4];
			memcpy(mask, &write_buffer[write_buffer_parse_pos], sizeof(mask));
			write_buffer_parse_pos += sizeof(mask);
			cio_websocket_mask(&write_buffer[write_buffer_parse_pos], first_length, mask);
		}

		uint16_t sc;
		memcpy(&sc, &write_buffer[write_buffer_parse_pos], sizeof(sc));
		sc = cio_be16toh(sc);
		write_buffer_parse_pos += sizeof(sc);
		first_length = (uint8_t)(first_length - sizeof(sc));
		write_buffer_parse_pos += first_length;
		if (status_code != sc) {
			return false;
		}
	}

	return true;
}